

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O2

int WOPN_LoadInstFromMem(OPNIFile *file,void *mem,size_t length)

{
  ushort version;
  int iVar1;
  long lVar2;
  int iVar3;
  long lStack_30;
  
  if (mem == (void *)0x0) {
    iVar3 = 6;
  }
  else {
    iVar3 = 2;
    if (10 < length) {
      lStack_30 = 0xb;
      iVar1 = bcmp(mem,"WOPN2-INST",0xb);
      if (iVar1 == 0) {
        version = 1;
        lVar2 = -0xb;
      }
      else {
        iVar1 = bcmp(mem,"WOPN2-IN2T",0xb);
        if (iVar1 != 0) {
          return 1;
        }
        if (length - 0xb < 2) {
          return 2;
        }
        version = *(ushort *)((long)mem + 0xb);
        if (2 < version) {
          return 4;
        }
        lStack_30 = -0xd;
        lVar2 = lStack_30;
        lStack_30 = 0xd;
      }
      file->version = version;
      if (lVar2 + length != 0) {
        file->is_drum = *(uint8_t *)((long)mem + lStack_30);
        if (0x41 < lVar2 + length) {
          iVar3 = 0;
          WOPN_parseInstrument(&file->inst,(uint8_t *)((long)mem + lStack_30) + 1,version,'\0');
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int WOPN_LoadInstFromMem(OPNIFile *file, void *mem, size_t length)
{
    uint16_t version = 0;
    uint8_t *cursor = (uint8_t *)mem;
    uint16_t ins_size;

    if(!cursor)
        return WOPN_ERR_NULL_POINTER;

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    {/* Magic number */
        if(length < 11)
            return WOPN_ERR_UNEXPECTED_ENDING;
        if(memcmp(cursor, opni_magic1, 11) == 0)
            version = 1;
        else if(memcmp(cursor, opni_magic2, 11) != 0)
            return WOPN_ERR_BAD_MAGIC;
        GO_FORWARD(11);
    }

    if (version == 0) {/* Version code */
        if(length < 2)
            return WOPN_ERR_UNEXPECTED_ENDING;
        version = toUint16LE(cursor);
        if(version > wopn_latest_version)
            return WOPN_ERR_NEWER_VERSION;
        GO_FORWARD(2);
    }

    file->version = version;

    {/* is drum flag */
        if(length < 1)
            return WOPN_ERR_UNEXPECTED_ENDING;
        file->is_drum = *cursor;
        GO_FORWARD(1);
    }

    if(version > 1)
        /* Skip sounding delays are not part of single-instrument file
         * two sizes of uint16_t will be subtracted */
        ins_size = WOPN_INST_SIZE_V2 - (sizeof(uint16_t) * 2);
    else
        ins_size = WOPN_INST_SIZE_V1;

    if(length < ins_size)
        return WOPN_ERR_UNEXPECTED_ENDING;

    WOPN_parseInstrument(&file->inst, cursor, version, 0);
    GO_FORWARD(ins_size);

    return WOPN_ERR_OK;
#undef GO_FORWARD
}